

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

void __thiscall gimage::View::setDepthImage(View *this,ImageFloat *d)

{
  Camera *this_00;
  long lVar1;
  long h;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  Image<float,_gimage::PixelTraits<float>_> *unaff_retaddr;
  Image<float,_gimage::PixelTraits<float>_> *a;
  
  a = in_RDI;
  if ((*(long *)(in_RDI + 2) != 0) &&
     (lVar1 = gmath::Camera::getWidth(*(Camera **)(in_RDI + 2)), 0 < lVar1)) {
    gmath::Camera::getHeight(*(Camera **)(in_RDI + 2));
  }
  lVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                    ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)in_RDI);
  if (0 < lVar1) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)in_RDI);
  }
  Image<float,_gimage::PixelTraits<float>_>::operator=(unaff_retaddr,a);
  if (((*(long *)(in_RDI + 2) != 0) &&
      (lVar1 = gmath::Camera::getWidth(*(Camera **)(in_RDI + 2)), lVar1 == 0)) &&
     (lVar1 = gmath::Camera::getHeight(*(Camera **)(in_RDI + 2)), lVar1 == 0)) {
    this_00 = *(Camera **)(in_RDI + 2);
    lVar1 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI + 1);
    h = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDI + 1);
    gmath::Camera::setSize(this_00,lVar1,h);
  }
  return;
}

Assistant:

void View::setDepthImage(const ImageFloat &d)
{
  // make sure that the size of the camera is the same as the size of the
  // images

  if (camera != 0 && camera->getWidth() > 0 && camera->getHeight() > 0)
  {
    assert(camera->getWidth() == d.getWidth());
    assert(camera->getHeight() == d.getHeight());
  }

  if (image.getWidth() > 0 && image.getHeight() > 0)
  {
    assert(d.getWidth() == image.getWidth());
    assert(d.getHeight() == image.getHeight());
  }

  depth=d;

  // set size of camera from images if neccessary

  if (camera != 0 && camera->getWidth() == 0 && camera->getHeight() == 0)
  {
    camera->setSize(depth.getWidth(), depth.getHeight());
  }
}